

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O1

ConstantFoldingRule *
spvtools::opt::anon_unknown_0::FoldBinaryOp
          (ConstantFoldingRule *__return_storage_ptr__,BinaryScalarFoldingRule *scalar_rule)

{
  _Manager_type p_Var1;
  undefined8 *puVar2;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type p_Stack_20;
  
  local_28 = (_Manager_type)0x0;
  p_Stack_20 = (_Invoker_type)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  p_Var1 = (scalar_rule->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)(&local_38,(_Any_data *)scalar_rule,__clone_functor);
    p_Stack_20 = scalar_rule->_M_invoker;
    local_28 = (scalar_rule->super__Function_base)._M_manager;
  }
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = p_Stack_20;
  if (local_28 != (_Manager_type)0x0) {
    *puVar2 = local_38._M_unused._M_object;
    puVar2[1] = local_38._8_8_;
    puVar2[2] = local_28;
    local_28 = (_Manager_type)0x0;
    p_Stack_20 = (_Invoker_type)0x0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar2;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp:726:10)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<const_spvtools::opt::analysis::Constant_*(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp:726:10)>
       ::_M_manager;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantFoldingRule FoldBinaryOp(BinaryScalarFoldingRule scalar_rule) {
  return [scalar_rule](IRContext* context, Instruction* inst,
                       const std::vector<const analysis::Constant*>& constants)
             -> const analysis::Constant* {
    assert(constants.size() == inst->NumInOperands());
    assert(constants.size() == (inst->opcode() == spv::Op::OpExtInst ? 3 : 2));
    analysis::ConstantManager* const_mgr = context->get_constant_mgr();
    analysis::TypeManager* type_mgr = context->get_type_mgr();
    const analysis::Type* result_type = type_mgr->GetType(inst->type_id());
    const analysis::Vector* vector_type = result_type->AsVector();

    const analysis::Constant* arg1 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[1] : constants[0];
    const analysis::Constant* arg2 =
        (inst->opcode() == spv::Op::OpExtInst) ? constants[2] : constants[1];

    if (arg1 == nullptr || arg2 == nullptr) {
      return nullptr;
    }

    if (vector_type == nullptr) {
      return scalar_rule(result_type, arg1, arg2, const_mgr);
    }

    std::vector<const analysis::Constant*> a_components;
    std::vector<const analysis::Constant*> b_components;
    std::vector<const analysis::Constant*> results_components;

    a_components = arg1->GetVectorComponents(const_mgr);
    b_components = arg2->GetVectorComponents(const_mgr);
    assert(a_components.size() == b_components.size());

    // Fold each component of the vector.
    for (uint32_t i = 0; i < a_components.size(); ++i) {
      results_components.push_back(scalar_rule(vector_type->element_type(),
                                               a_components[i], b_components[i],
                                               const_mgr));
      if (results_components[i] == nullptr) {
        return nullptr;
      }
    }

    // Build the constant object and return it.
    std::vector<uint32_t> ids;
    for (const analysis::Constant* member : results_components) {
      ids.push_back(const_mgr->GetDefiningInstruction(member)->result_id());
    }
    return const_mgr->GetConstant(vector_type, ids);
  };
}